

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_datanode.c
# Opt level: O3

SUNErrCode SUNDataNode_SetDataNvector(SUNDataNode self,N_Vector v,sunrealtype t)

{
  _func_SUNErrCode_SUNDataNode_N_Vector_sunrealtype *UNRECOVERED_JUMPTABLE;
  SUNErrCode SVar1;
  
  UNRECOVERED_JUMPTABLE = self->ops->setdatanvector;
  if (UNRECOVERED_JUMPTABLE != (_func_SUNErrCode_SUNDataNode_N_Vector_sunrealtype *)0x0) {
    SVar1 = (*UNRECOVERED_JUMPTABLE)(self,v,t);
    return SVar1;
  }
  return -0x2701;
}

Assistant:

SUNErrCode SUNDataNode_SetDataNvector(SUNDataNode self, N_Vector v, sunrealtype t)
{
  SUNFunctionBegin(self->sunctx);

  SUNDIALS_MARK_FUNCTION_BEGIN(SUNCTX_->profiler);

  if (self->ops->setdatanvector)
  {
    SUNErrCode err = self->ops->setdatanvector(self, v, t);
    SUNDIALS_MARK_FUNCTION_END(SUNCTX_->profiler);
    return err;
  }

  SUNDIALS_MARK_FUNCTION_END(SUNCTX_->profiler);
  return SUN_ERR_NOT_IMPLEMENTED;
}